

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O2

vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
* __thiscall
cfd::core::DescriptorNode::GetReferences
          (vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
           *__return_storage_ptr__,DescriptorNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *array_argument,DescriptorNode *parent)

{
  DescriptorScriptType *__args_1;
  pointer pDVar1;
  __type _Var2;
  bool bVar3;
  Bip32FormatType BVar4;
  reference __lhs;
  long lVar5;
  unsigned_long uVar6;
  ScriptBuilder *pSVar7;
  CfdException *pCVar8;
  uint32_t uVar9;
  DescriptorKeyReference *this_00;
  ulong uVar10;
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_> keys
  ;
  Pubkey pubkey;
  Script locking_script;
  TapBranch branch;
  ScriptBuilder build;
  ScriptElement elem;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_360;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_348;
  Script script;
  
  if (((array_argument !=
        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x0) && (this->depth_ == 0)) &&
     (0x20 < (ulong)((long)(array_argument->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(array_argument->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start))) {
    ::std::
    __reverse<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ();
  }
  (__return_storage_ptr__->
  super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  build._vptr_ScriptBuilder = (_func_int **)&PTR__ScriptBuilder_006f8aa0;
  build.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  build.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  build.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Script::Script(&locking_script);
  if (this->node_type_ != kDescriptorTypeScript) {
    if (this->node_type_ == kDescriptorTypeNumber) {
      ScriptElement::ScriptElement(&elem,(ulong)this->number_);
      ScriptBuilder::AppendElement(&build,&elem);
      ScriptElement::~ScriptElement(&elem);
    }
    goto LAB_00385317;
  }
  __args_1 = &this->script_type_;
  switch(this->script_type_) {
  case kDescriptorScriptSh:
  case kDescriptorScriptWsh:
    GetReference((DescriptorScriptReference *)&elem,
                 (this->child_node_).
                 super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
                 ._M_impl.super__Vector_impl_data._M_start,array_argument,this);
    Script::Script(&script,(Script *)&elem.type_);
    if (*__args_1 == kDescriptorScriptWsh) {
      ScriptUtil::CreateP2wshLockingScript((Script *)&branch,&script);
      Script::operator=(&locking_script,(Script *)&branch);
    }
    else {
      ScriptUtil::CreateP2shLockingScript((Script *)&branch,&script);
      Script::operator=(&locking_script,(Script *)&branch);
    }
    Script::~Script((Script *)&branch);
    ::std::
    vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
    ::
    emplace_back<cfd::core::Script&,cfd::core::DescriptorScriptType_const&,cfd::core::DescriptorScriptReference&,std::vector<cfd::core::AddressFormatData,std::allocator<cfd::core::AddressFormatData>>const&>
              ((vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
                *)__return_storage_ptr__,&locking_script,__args_1,(DescriptorScriptReference *)&elem
               ,&this->addr_prefixes_);
    Script::~Script(&script);
    DescriptorScriptReference::~DescriptorScriptReference((DescriptorScriptReference *)&elem);
    break;
  default:
    keys.
    super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    keys.
    super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    keys.
    super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    GetKeyReferences((DescriptorKeyReference *)&script,
                     (this->child_node_).
                     super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
                     ._M_impl.super__Vector_impl_data._M_start,array_argument);
    ::std::
    vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>::
    push_back(&keys,(value_type *)&script);
    BVar4 = kNormal;
    if (((uint)script._vptr_Script & 0xfffffffe) == 2) {
      DescriptorKeyReference::GetExtPubkey((ExtPubkey *)&elem,(DescriptorKeyReference *)&script);
      BVar4 = Extkey::GetFormatType((Extkey *)&elem);
      Extkey::~Extkey((Extkey *)&elem);
    }
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&pubkey,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&script.script_stack_);
    switch(*__args_1) {
    case kDescriptorScriptPk:
      if (BVar4 != kNormal) {
        pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::__cxx11::string::string
                  ((string *)&elem,"invalid bip32 format. pk is not using bip49 or bip84.",
                   (allocator *)&branch);
        CfdException::CfdException(pCVar8,kCfdIllegalArgumentError,(string *)&elem);
        __cxa_throw(pCVar8,&CfdException::typeinfo,CfdException::~CfdException);
      }
      bVar3 = ::std::operator==(&this->parent_kind_,"tr");
      if (bVar3) {
        SchnorrPubkey::FromPubkey((SchnorrPubkey *)&branch,&pubkey,(bool *)0x0);
        SchnorrPubkey::GetData((ByteData *)&elem,(SchnorrPubkey *)&branch);
        pSVar7 = ScriptBuilder::operator<<(&build,(ByteData *)&elem);
        ScriptBuilder::operator<<(pSVar7,(ScriptOperator *)ScriptOperator::OP_CHECKSIG);
        ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&elem);
        ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&branch);
      }
      else {
        pSVar7 = ScriptBuilder::operator<<(&build,&pubkey);
        ScriptBuilder::operator<<(pSVar7,(ScriptOperator *)ScriptOperator::OP_CHECKSIG);
      }
      ScriptBuilder::Build((Script *)&elem,&build);
      Script::operator=(&locking_script,(Script *)&elem);
      break;
    case kDescriptorScriptPkh:
      if (BVar4 != kNormal) {
        pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::__cxx11::string::string
                  ((string *)&elem,"invalid bip32 format. pkh is not using bip49 or bip84.",
                   (allocator *)&branch);
        CfdException::CfdException(pCVar8,kCfdIllegalArgumentError,(string *)&elem);
        __cxa_throw(pCVar8,&CfdException::typeinfo,CfdException::~CfdException);
      }
      ScriptUtil::CreateP2pkhLockingScript((Script *)&elem,&pubkey);
      Script::operator=(&locking_script,(Script *)&elem);
      break;
    case kDescriptorScriptWpkh:
      if (BVar4 == kBip49) {
        if ((parent == (DescriptorNode *)0x0) || (parent->script_type_ != kDescriptorScriptSh)) {
          pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
          ::std::__cxx11::string::string
                    ((string *)&elem,"invalid bip32 format. bip49 is using sh-wpkh only.",
                     (allocator *)&branch);
          CfdException::CfdException(pCVar8,kCfdIllegalArgumentError,(string *)&elem);
          __cxa_throw(pCVar8,&CfdException::typeinfo,CfdException::~CfdException);
        }
      }
      else if (parent != (DescriptorNode *)0x0 && BVar4 == kBip84) {
        pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::__cxx11::string::string
                  ((string *)&elem,"invalid bip32 format. bip84 is using wpkh only.",
                   (allocator *)&branch);
        CfdException::CfdException(pCVar8,kCfdIllegalArgumentError,(string *)&elem);
        __cxa_throw(pCVar8,&CfdException::typeinfo,CfdException::~CfdException);
      }
      ScriptUtil::CreateP2wpkhLockingScript((Script *)&elem,&pubkey);
      Script::operator=(&locking_script,(Script *)&elem);
      break;
    case kDescriptorScriptCombo:
      bVar3 = Pubkey::IsCompress(&pubkey);
      if (bVar3) {
        if (BVar4 == kBip49) {
LAB_00385cd3:
          DescriptorScriptReference::DescriptorScriptReference
                    ((DescriptorScriptReference *)&elem,&locking_script,kDescriptorScriptWpkh,&keys,
                     &this->addr_prefixes_,0);
          ScriptUtil::CreateP2shLockingScript((Script *)&branch,&locking_script);
          Script::operator=(&locking_script,(Script *)&branch);
          Script::~Script((Script *)&branch);
          ::std::
          vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
          ::
          emplace_back<cfd::core::Script&,cfd::core::DescriptorScriptType_const&,cfd::core::DescriptorScriptReference&,std::vector<cfd::core::AddressFormatData,std::allocator<cfd::core::AddressFormatData>>const&>
                    ((vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
                      *)__return_storage_ptr__,&locking_script,__args_1,
                     (DescriptorScriptReference *)&elem,&this->addr_prefixes_);
          DescriptorScriptReference::~DescriptorScriptReference((DescriptorScriptReference *)&elem);
          goto LAB_00385d53;
        }
        ScriptUtil::CreateP2wpkhLockingScript((Script *)&elem,&pubkey);
        Script::operator=(&locking_script,(Script *)&elem);
        Script::~Script((Script *)&elem);
        ::std::
        vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
        ::
        emplace_back<cfd::core::Script&,cfd::core::DescriptorScriptType_const&,std::vector<cfd::core::DescriptorKeyReference,std::allocator<cfd::core::DescriptorKeyReference>>&,std::vector<cfd::core::AddressFormatData,std::allocator<cfd::core::AddressFormatData>>const&>
                  ((vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
                    *)__return_storage_ptr__,&locking_script,__args_1,&keys,&this->addr_prefixes_);
        if (BVar4 != kBip84) goto LAB_00385cd3;
      }
      else {
LAB_00385d53:
        if (BVar4 == kNormal) {
          ScriptUtil::CreateP2pkhLockingScript((Script *)&elem,&pubkey);
          Script::operator=(&locking_script,(Script *)&elem);
          Script::~Script((Script *)&elem);
          ::std::
          vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
          ::
          emplace_back<cfd::core::Script&,cfd::core::DescriptorScriptType_const&,std::vector<cfd::core::DescriptorKeyReference,std::allocator<cfd::core::DescriptorKeyReference>>&,std::vector<cfd::core::AddressFormatData,std::allocator<cfd::core::AddressFormatData>>const&>
                    ((vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
                      *)__return_storage_ptr__,&locking_script,__args_1,&keys,&this->addr_prefixes_)
          ;
          pSVar7 = ScriptBuilder::operator<<(&build,&pubkey);
          ScriptBuilder::operator<<(pSVar7,(ScriptOperator *)ScriptOperator::OP_CHECKSIG);
          ScriptBuilder::Build((Script *)&elem,&build);
          Script::operator=(&locking_script,(Script *)&elem);
          Script::~Script((Script *)&elem);
          goto switchD_003855c4_default;
        }
      }
      goto LAB_00385ee4;
    default:
      goto switchD_003855c4_default;
    }
    Script::~Script((Script *)&elem);
switchD_003855c4_default:
    ::std::
    vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
    ::
    emplace_back<cfd::core::Script&,cfd::core::DescriptorScriptType_const&,std::vector<cfd::core::DescriptorKeyReference,std::allocator<cfd::core::DescriptorKeyReference>>&,std::vector<cfd::core::AddressFormatData,std::allocator<cfd::core::AddressFormatData>>const&>
              ((vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
                *)__return_storage_ptr__,&locking_script,__args_1,&keys,&this->addr_prefixes_);
LAB_00385ee4:
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pubkey);
    this_00 = (DescriptorKeyReference *)&script;
    goto LAB_00385ef6;
  case kDescriptorScriptMulti:
  case kDescriptorScriptSortedMulti:
    uVar9 = ((this->child_node_).
             super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
             ._M_impl.super__Vector_impl_data._M_start)->number_;
    branch._vptr_TapBranch = (_func_int **)0x0;
    branch.has_leaf_ = false;
    branch.leaf_version_ = '\0';
    branch._10_6_ = 0;
    branch.script_._vptr_Script = (_func_int **)0x0;
    keys.
    super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    keys.
    super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    keys.
    super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = uVar9;
    DescriptorKeyReference::DescriptorKeyReference((DescriptorKeyReference *)&elem);
    lVar5 = 0x170;
    for (uVar10 = 1;
        pDVar1 = (this->child_node_).
                 super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        uVar10 < (ulong)(((long)(this->child_node_).
                                super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar1) / 0x170);
        uVar10 = uVar10 + 1) {
      GetKeyReferences((DescriptorKeyReference *)&script,
                       (DescriptorNode *)((long)&(pDVar1->name_)._M_dataplus._M_p + lVar5),
                       array_argument);
      DescriptorKeyReference::operator=
                ((DescriptorKeyReference *)&elem,(DescriptorKeyReference *)&script);
      DescriptorKeyReference::~DescriptorKeyReference((DescriptorKeyReference *)&script);
      ::std::
      vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
      ::push_back(&keys,(DescriptorKeyReference *)&elem);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&script,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&elem.op_code_.text_data_)
      ;
      ::std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::
      emplace_back<cfd::core::Pubkey>
                ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)&branch,
                 (Pubkey *)&script);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&script);
      lVar5 = lVar5 + 0x170;
    }
    if (*__args_1 == kDescriptorScriptSortedMulti) {
      ::std::
      __sort<__gnu_cxx::__normal_iterator<cfd::core::Pubkey*,std::vector<cfd::core::Pubkey,std::allocator<cfd::core::Pubkey>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(cfd::core::Pubkey_const&,cfd::core::Pubkey_const&)>>
                ((__normal_iterator<cfd::core::Pubkey_*,_std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>_>
                  )branch._vptr_TapBranch,
                 (__normal_iterator<cfd::core::Pubkey_*,_std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>_>
                  )branch._8_8_,
                 (_Iter_comp_iter<bool_(*)(const_cfd::core::Pubkey_&,_const_cfd::core::Pubkey_&)>)
                 0x39e106);
    }
    if (parent == (DescriptorNode *)0x0) {
      bVar3 = false;
    }
    else {
      bVar3 = parent->script_type_ == kDescriptorScriptWsh;
    }
    ScriptUtil::CreateMultisigRedeemScript
              (&script,uVar9,
               (vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)&branch,bVar3);
    Script::operator=(&locking_script,&script);
    Script::~Script(&script);
    ::std::
    vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
    ::
    emplace_back<cfd::core::Script&,cfd::core::DescriptorScriptType_const&,std::vector<cfd::core::DescriptorKeyReference,std::allocator<cfd::core::DescriptorKeyReference>>&,std::vector<cfd::core::AddressFormatData,std::allocator<cfd::core::AddressFormatData>>const&,unsigned_int&>
              ((vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
                *)__return_storage_ptr__,&locking_script,__args_1,&keys,&this->addr_prefixes_,
               (uint *)&pubkey);
    DescriptorKeyReference::~DescriptorKeyReference((DescriptorKeyReference *)&elem);
    ::std::
    vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>::
    ~vector(&keys);
    ::std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector
              ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)&branch);
    break;
  case kDescriptorScriptAddr:
    core::Address::Address((Address *)&elem,&this->value_,&this->addr_prefixes_);
    ::std::
    vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
    ::
    emplace_back<cfd::core::Address&,std::vector<cfd::core::AddressFormatData,std::allocator<cfd::core::AddressFormatData>>const&>
              ((vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
                *)__return_storage_ptr__,(Address *)&elem,&this->addr_prefixes_);
    core::Address::GetLockingScript(&script,(Address *)&elem);
    Script::operator=(&locking_script,&script);
    Script::~Script(&script);
    core::Address::~Address((Address *)&elem);
    break;
  case kDescriptorScriptRaw:
    Script::Script((Script *)&elem,&this->value_);
    Script::operator=(&locking_script,(Script *)&elem);
    Script::~Script((Script *)&elem);
    ::std::
    vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
    ::
    emplace_back<cfd::core::Script&,cfd::core::DescriptorScriptType_const&,std::vector<cfd::core::AddressFormatData,std::allocator<cfd::core::AddressFormatData>>const&>
              ((vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
                *)__return_storage_ptr__,&locking_script,__args_1,&this->addr_prefixes_);
    break;
  case kDescriptorScriptMiniscript:
    if (this->need_arg_num_ == 0) {
LAB_00385714:
      uVar9 = 0;
    }
    else {
      if ((array_argument ==
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x0) ||
         ((array_argument->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start ==
          (array_argument->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish)) {
        elem._vptr_ScriptElement = (_func_int **)0x5ded0e;
        elem.type_ = 0x673;
        elem.op_code_._vptr_ScriptOperator = (_func_int **)anon_var_dwarf_525104;
        logger::warn<>((CfdSourceLocation *)&elem,"Failed to generate miniscript from hdkey.");
        pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::__cxx11::string::string
                  ((string *)&elem,"Failed to generate miniscript from hdkey.",(allocator *)&script)
        ;
        CfdException::CfdException(pCVar8,kCfdIllegalArgumentError,(string *)&elem);
        __cxa_throw(pCVar8,&CfdException::typeinfo,CfdException::~CfdException);
      }
      __lhs = ::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::at(array_argument,0);
      ::std::__cxx11::string::string((string *)&elem,"base",(allocator *)&script);
      _Var2 = ::std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&elem);
      ::std::__cxx11::string::~string((string *)&elem);
      if (_Var2) goto LAB_00385714;
      ::std::__cxx11::string::string
                ((string *)&elem,
                 (string *)
                 ((array_argument->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish + -1));
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::pop_back(array_argument);
      lVar5 = ::std::__cxx11::string::rfind((char *)&elem,0x5dd406);
      if (lVar5 != -1) {
        script._vptr_Script = (_func_int **)0x5ded0e;
        script.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start._0_4_ = 0x680;
        script.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish = "GetReferences";
        logger::warn<>((CfdSourceLocation *)&script,
                       "Failed to invalid argument. miniscript is single child.");
        pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::__cxx11::string::string
                  ((string *)&script,"Failed to invalid argument. miniscript is single child.",
                   (allocator *)&branch);
        CfdException::CfdException(pCVar8,kCfdIllegalArgumentError,(string *)&script);
        __cxa_throw(pCVar8,&CfdException::typeinfo,CfdException::~CfdException);
      }
      branch._vptr_TapBranch = (_func_int **)0x0;
      uVar6 = ::std::__cxx11::stoul((string *)&elem,(size_t *)&branch,10);
      uVar9 = (uint32_t)uVar6;
      if ((branch._vptr_TapBranch != (_func_int **)0x0) &&
         (branch._vptr_TapBranch < (_func_int **)CONCAT44(elem._12_4_,elem.type_))) {
        script._vptr_Script = (_func_int **)0x5ded0e;
        script.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start._0_4_ = 0x689;
        script.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish = "GetReferences";
        logger::warn<>((CfdSourceLocation *)&script,"Failed to invalid argument. number only.");
        pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::__cxx11::string::string
                  ((string *)&script,"Failed to invalid argument. number only.",(allocator *)&keys);
        CfdException::CfdException(pCVar8,kCfdIllegalArgumentError,(string *)&script);
        __cxa_throw(pCVar8,&CfdException::typeinfo,CfdException::~CfdException);
      }
      ::std::__cxx11::string::~string((string *)&elem);
    }
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&script,(ulong)this->number_
               ,(allocator_type *)&elem);
    keys.
    super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    bVar3 = ::std::operator==(&this->parent_kind_,"tr");
    pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ =
         wally_descriptor_parse_miniscript
                   ((this->value_)._M_dataplus._M_p,(char **)0x0,(char **)0x0,0,uVar9,(uint)bVar3,
                    (uchar *)script._vptr_Script,
                    CONCAT44(script.script_data_.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start._4_4_,
                             script.script_data_.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start._0_4_) -
                    (long)script._vptr_Script,(size_t *)&keys);
    if (((uint32_t)
         pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_start != 0) ||
       ((pointer)(CONCAT44(script.script_data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,
                           script.script_data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._0_4_) - (long)script._vptr_Script) <
        keys.
        super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
        ._M_impl.super__Vector_impl_data._M_start)) {
      elem._vptr_ScriptElement = (_func_int **)0x5ded0e;
      elem.type_ = 0x69b;
      elem.op_code_._vptr_ScriptOperator = (_func_int **)anon_var_dwarf_525104;
      logger::warn<int&,unsigned_long&>
                ((CfdSourceLocation *)&elem,"Failed to parse miniscript.({}, size:{})",
                 (int *)&pubkey,(unsigned_long *)&keys);
      pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)&elem,"Failed to parse miniscript.",(allocator *)&branch);
      CfdException::CfdException(pCVar8,kCfdIllegalArgumentError,(string *)&elem);
      __cxa_throw(pCVar8,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ByteData::ByteData((ByteData *)&branch,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&script);
    Script::Script((Script *)&elem,(ByteData *)&branch);
    Script::operator=(&locking_script,(Script *)&elem);
    Script::~Script((Script *)&elem);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&branch);
    ::std::
    vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
    ::
    emplace_back<cfd::core::Script&,cfd::core::DescriptorScriptType_const&,std::vector<cfd::core::AddressFormatData,std::allocator<cfd::core::AddressFormatData>>const&>
              ((vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
                *)__return_storage_ptr__,&locking_script,__args_1,&this->addr_prefixes_);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&script);
    break;
  case kDescriptorScriptTaproot:
    keys.
    super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    keys.
    super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    keys.
    super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    GetKeyReferences((DescriptorKeyReference *)&elem,
                     (this->child_node_).
                     super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
                     ._M_impl.super__Vector_impl_data._M_start,array_argument);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&pubkey,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&elem.type_);
    ::std::
    vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>::
    push_back(&keys,(value_type *)&elem);
    TapBranch::TapBranch(&branch,this->network_type_);
    pDVar1 = (this->child_node_).
             super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (1 < (ulong)(((long)(this->child_node_).
                           super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar1) / 0x170)) {
      GetTapBranch((TapBranch *)&script,pDVar1 + 1,array_argument);
      TapBranch::operator=(&branch,(TapBranch *)&script);
      TapBranch::~TapBranch((TapBranch *)&script);
    }
    bVar3 = TapBranch::HasTapLeaf(&branch);
    if (bVar3) {
      TaprootScriptTree::TaprootScriptTree((TaprootScriptTree *)&script,&branch);
      TaprootUtil::CreateTapScriptControl
                ((ByteData *)&local_348,(SchnorrPubkey *)&pubkey,(TapBranch *)&script,
                 (SchnorrPubkey *)0x0,&locking_script);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_348);
      ::std::
      vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
      ::
      emplace_back<cfd::core::Script&,cfd::core::DescriptorScriptType_const&,std::vector<cfd::core::DescriptorKeyReference,std::allocator<cfd::core::DescriptorKeyReference>>&,cfd::core::TaprootScriptTree&,std::vector<cfd::core::AddressFormatData,std::allocator<cfd::core::AddressFormatData>>const&>
                ((vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
                  *)__return_storage_ptr__,&locking_script,__args_1,&keys,
                 (TaprootScriptTree *)&script,&this->addr_prefixes_);
      TaprootScriptTree::~TaprootScriptTree((TaprootScriptTree *)&script);
    }
    else {
      TaprootUtil::CreateTapScriptControl
                ((ByteData *)&local_360,(SchnorrPubkey *)&pubkey,&branch,(SchnorrPubkey *)0x0,
                 &locking_script);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_360);
      ::std::
      vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
      ::
      emplace_back<cfd::core::Script&,cfd::core::DescriptorScriptType_const&,std::vector<cfd::core::DescriptorKeyReference,std::allocator<cfd::core::DescriptorKeyReference>>&,cfd::core::TapBranch&,std::vector<cfd::core::AddressFormatData,std::allocator<cfd::core::AddressFormatData>>const&>
                ((vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
                  *)__return_storage_ptr__,&locking_script,__args_1,&keys,&branch,
                 &this->addr_prefixes_);
    }
    TapBranch::~TapBranch(&branch);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pubkey);
    this_00 = (DescriptorKeyReference *)&elem;
LAB_00385ef6:
    DescriptorKeyReference::~DescriptorKeyReference(this_00);
    ::std::
    vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>::
    ~vector(&keys);
  }
LAB_00385317:
  Script::~Script(&locking_script);
  ScriptBuilder::~ScriptBuilder(&build);
  return __return_storage_ptr__;
}

Assistant:

std::vector<DescriptorScriptReference> DescriptorNode::GetReferences(
    std::vector<std::string>* array_argument,
    const DescriptorNode* parent) const {
  if ((depth_ == 0) && (array_argument) && (array_argument->size() > 1)) {
    std::reverse(array_argument->begin(), array_argument->end());
  }
  std::vector<DescriptorScriptReference> result;
  ScriptBuilder build;
  Script locking_script;

  if (node_type_ == DescriptorNodeType::kDescriptorTypeKey) {
    // do nothing
  } else if (node_type_ == DescriptorNodeType::kDescriptorTypeNumber) {
    ScriptElement elem(static_cast<int64_t>(number_));
    build.AppendElement(elem);
  } else if (node_type_ == DescriptorNodeType::kDescriptorTypeScript) {
    if (script_type_ == DescriptorScriptType::kDescriptorScriptMiniscript) {
      uint32_t child_num = 0;
      if (need_arg_num_ == 0) {
        // do nothing
      } else if ((array_argument == nullptr) || array_argument->empty()) {
        warn(CFD_LOG_SOURCE, "Failed to generate miniscript from hdkey.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to generate miniscript from hdkey.");
      } else if (
          (array_argument != nullptr) && (!array_argument->empty()) &&
          (array_argument->at(0) == std::string(kArgumentBaseExtkey))) {
        // do nothing
      } else if (array_argument != nullptr) {
        std::string arg_value = array_argument->back();
        array_argument->pop_back();
        if (arg_value.rfind("/") != std::string::npos) {
          warn(
              CFD_LOG_SOURCE,
              "Failed to invalid argument. miniscript is single child.");
          throw CfdException(
              CfdError::kCfdIllegalArgumentError,
              "Failed to invalid argument. miniscript is single child.");
        }
        std::size_t end_pos = 0;
        child_num = static_cast<uint32_t>(std::stoul(arg_value, &end_pos, 10));
        if ((end_pos != 0) && (end_pos < arg_value.size())) {
          warn(CFD_LOG_SOURCE, "Failed to invalid argument. number only.");
          throw CfdException(
              CfdError::kCfdIllegalArgumentError,
              "Failed to invalid argument. number only.");
        }
      }
      std::vector<uint8_t> script(number_);
      size_t written = 0;
      uint32_t flags = 0;
      if (parent_kind_ == "tr") flags = WALLY_MINISCRIPT_TAPSCRIPT;
      int ret = wally_descriptor_parse_miniscript(
          value_.c_str(), nullptr, nullptr, 0, child_num, flags, script.data(),
          script.size(), &written);
      if ((ret == WALLY_OK) && (written <= script.size())) {
        locking_script = Script(script);
        result.emplace_back(locking_script, script_type_, addr_prefixes_);
      } else {
        warn(
            CFD_LOG_SOURCE, "Failed to parse miniscript.({}, size:{})", ret,
            written);
        throw CfdException(
            CfdError::kCfdIllegalArgumentError, "Failed to parse miniscript.");
      }
    } else if (script_type_ == DescriptorScriptType::kDescriptorScriptRaw) {
      locking_script = Script(value_);
      result.emplace_back(locking_script, script_type_, addr_prefixes_);
    } else if (script_type_ == DescriptorScriptType::kDescriptorScriptAddr) {
      Address addr(value_, addr_prefixes_);
      result.emplace_back(addr, addr_prefixes_);
      locking_script = addr.GetLockingScript();
    } else if (
        (script_type_ == DescriptorScriptType::kDescriptorScriptMulti) ||
        (script_type_ == DescriptorScriptType::kDescriptorScriptSortedMulti)) {
      uint32_t reqnum = child_node_[0].number_;
      std::vector<Pubkey> pubkeys;
      std::vector<DescriptorKeyReference> keys;
      DescriptorKeyReference key_ref;
      for (size_t index = 1; index < child_node_.size(); ++index) {
        key_ref = child_node_[index].GetKeyReferences(array_argument);
        keys.push_back(key_ref);
        pubkeys.push_back(key_ref.GetPubkey());
      }
      if (script_type_ == DescriptorScriptType::kDescriptorScriptSortedMulti) {
        // https://github.com/bitcoin/bips/blob/master/bip-0067.mediawiki
        std::sort(pubkeys.begin(), pubkeys.end(), Pubkey::IsLarge);
      }
      bool has_witness = false;
      if ((parent != nullptr) &&
          (parent->GetScriptType() ==
           DescriptorScriptType::kDescriptorScriptWsh)) {
        has_witness = true;
      }
      locking_script =
          ScriptUtil::CreateMultisigRedeemScript(reqnum, pubkeys, has_witness);
      result.emplace_back(
          locking_script, script_type_, keys, addr_prefixes_, reqnum);
    } else if (
        (script_type_ == DescriptorScriptType::kDescriptorScriptSh) ||
        (script_type_ == DescriptorScriptType::kDescriptorScriptWsh)) {
      DescriptorScriptReference ref =
          child_node_[0].GetReference(array_argument, this);
      Script script = ref.GetLockingScript();
      if (script_type_ == DescriptorScriptType::kDescriptorScriptWsh) {
        locking_script = ScriptUtil::CreateP2wshLockingScript(script);
      } else {
        locking_script = ScriptUtil::CreateP2shLockingScript(script);
      }
      result.emplace_back(locking_script, script_type_, ref, addr_prefixes_);
    } else if (
        script_type_ == DescriptorScriptType::kDescriptorScriptTaproot) {
      std::vector<DescriptorKeyReference> keys;
      DescriptorKeyReference ref =
          child_node_[0].GetKeyReferences(array_argument);
      SchnorrPubkey pubkey = ref.GetSchnorrPubkey();
      keys.push_back(ref);
      TapBranch branch(network_type_);
      if (child_node_.size() >= 2) {
        branch = child_node_[1].GetTapBranch(array_argument);
      }
      if (branch.HasTapLeaf()) {
        TaprootScriptTree tree(branch);
        TaprootUtil::CreateTapScriptControl(
            pubkey, tree, nullptr, &locking_script);
        result.emplace_back(
            locking_script, script_type_, keys, tree, addr_prefixes_);
      } else {
        // see: https://github.com/bitcoin/bips/blob/master/bip-0086.mediawiki
        // see: https://github.com/bitcoin/bips/blob/master/bip-0341.mediawiki#cite_note-22 // NOLINT
        TaprootUtil::CreateTapScriptControl(
            pubkey, branch, nullptr, &locking_script);
        result.emplace_back(
            locking_script, script_type_, keys, branch, addr_prefixes_);
      }
    } else {
      std::vector<DescriptorKeyReference> keys;
      DescriptorKeyReference ref =
          child_node_[0].GetKeyReferences(array_argument);
      keys.push_back(ref);
      Bip32FormatType bip32_type = Bip32FormatType::kNormal;
      if (ref.HasExtPubkey()) {
        bip32_type = ref.GetExtPubkey().GetFormatType();
      }
      Pubkey pubkey = ref.GetPubkey();
      if (script_type_ == DescriptorScriptType::kDescriptorScriptCombo) {
        if (pubkey.IsCompress()) {
          if (bip32_type != Bip32FormatType::kBip49) {
            // p2wpkh
            locking_script = ScriptUtil::CreateP2wpkhLockingScript(pubkey);
            result.emplace_back(
                locking_script, script_type_, keys, addr_prefixes_);
          }

          if (bip32_type != Bip32FormatType::kBip84) {
            // p2sh-p2wpkh
            DescriptorScriptReference child_script(
                locking_script, DescriptorScriptType::kDescriptorScriptWpkh,
                keys, addr_prefixes_);
            locking_script =
                ScriptUtil::CreateP2shLockingScript(locking_script);
            result.emplace_back(
                locking_script, script_type_, child_script, addr_prefixes_);
          }
        }

        if (bip32_type == Bip32FormatType::kNormal) {
          // p2pkh
          locking_script = ScriptUtil::CreateP2pkhLockingScript(pubkey);
          result.emplace_back(
              locking_script, script_type_, keys, addr_prefixes_);

          // p2pk
          build << pubkey << ScriptOperator::OP_CHECKSIG;
          locking_script = build.Build();
          result.emplace_back(
              locking_script, script_type_, keys, addr_prefixes_);
        }
      } else {
        if (script_type_ == DescriptorScriptType::kDescriptorScriptPkh) {
          if (bip32_type != Bip32FormatType::kNormal) {
            throw CfdException(
                CfdError::kCfdIllegalArgumentError,
                "invalid bip32 format. pkh is not using bip49 or bip84.");
          }
          locking_script = ScriptUtil::CreateP2pkhLockingScript(pubkey);
        } else if (
            script_type_ == DescriptorScriptType::kDescriptorScriptWpkh) {
          if ((bip32_type == Bip32FormatType::kBip49) &&
              ((parent == nullptr) ||
               (parent->GetScriptType() !=
                DescriptorScriptType::kDescriptorScriptSh))) {
            throw CfdException(
                CfdError::kCfdIllegalArgumentError,
                "invalid bip32 format. bip49 is using sh-wpkh only.");
          } else if (
              (bip32_type == Bip32FormatType::kBip84) && (parent != nullptr)) {
            throw CfdException(
                CfdError::kCfdIllegalArgumentError,
                "invalid bip32 format. bip84 is using wpkh only.");
          }
          locking_script = ScriptUtil::CreateP2wpkhLockingScript(pubkey);
        } else if (script_type_ == DescriptorScriptType::kDescriptorScriptPk) {
          if (bip32_type != Bip32FormatType::kNormal) {
            throw CfdException(
                CfdError::kCfdIllegalArgumentError,
                "invalid bip32 format. pk is not using bip49 or bip84.");
          }
          if (parent_kind_ == "tr") {
            build << SchnorrPubkey::FromPubkey(pubkey).GetData()
                  << ScriptOperator::OP_CHECKSIG;
          } else {
            build << pubkey << ScriptOperator::OP_CHECKSIG;
          }
          locking_script = build.Build();
        }
        result.emplace_back(
            locking_script, script_type_, keys, addr_prefixes_);
      }
    }
  } else {
    // do nothing
  }

  return result;
}